

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall irr::video::COpenGL3DriverBase::setRenderStates3DMode(COpenGL3DriverBase *this)

{
  E_MATERIAL_TYPE EVar1;
  COpenGL3CacheHandler *pCVar2;
  pointer pSVar3;
  IMaterialRenderer *pIVar4;
  u32 uVar5;
  u32 uVar6;
  u32 uVar7;
  u8 uVar8;
  undefined2 uVar9;
  f32 fVar10;
  f32 fVar11;
  f32 fVar12;
  bool bVar13;
  SMaterialLayer *other;
  long lVar14;
  
  if (this->LockRenderStateMode == false) {
    if (this->CurrentRenderMode != ERM_3D) {
      pCVar2 = this->CacheHandler;
      if ((*pCVar2->Blend != false) || (pCVar2->BlendInvalid == true)) {
        (*GL.Disable)(0xbe2);
        if ((ulong)pCVar2->FrameBufferCount != 0) {
          memset(pCVar2->Blend,0,(ulong)pCVar2->FrameBufferCount);
        }
        pCVar2->BlendInvalid = false;
      }
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::setBlendFunc(this->CacheHandler,0x302,0x303);
      this->ResetRenderStates = true;
    }
    if ((this->ResetRenderStates != false) ||
       (bVar13 = SMaterial::operator!=(&this->LastMaterial,&this->Material), bVar13)) {
      if ((this->CurrentRenderMode == ERM_2D) &&
         (this->MaterialRenderer2DActive != (COpenGL3Renderer2D *)0x0)) {
        (*(this->MaterialRenderer2DActive->super_COpenGL3MaterialRenderer).super_IMaterialRenderer.
          _vptr_IMaterialRenderer[2])();
        this->MaterialRenderer2DActive = (COpenGL3Renderer2D *)0x0;
      }
      else {
        EVar1 = (this->LastMaterial).MaterialType;
        if ((EVar1 != (this->Material).MaterialType) &&
           (pSVar3 = (this->super_CNullDriver).MaterialRenderers.m_data.
                     super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                              super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pSVar3) >> 3) * -0x33333333))) {
          (*(pSVar3[EVar1].Renderer)->_vptr_IMaterialRenderer[2])();
        }
      }
      other = (this->Material).TextureLayers;
      EVar1 = (this->Material).MaterialType;
      pSVar3 = (this->super_CNullDriver).MaterialRenderers.m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pSVar3) >> 3) * -0x33333333)) {
        pIVar4 = pSVar3[EVar1].Renderer;
        (**pIVar4->_vptr_IMaterialRenderer)
                  (pIVar4,other,&this->LastMaterial,(ulong)this->ResetRenderStates,
                   &(this->super_CNullDriver).field_0x490);
      }
      lVar14 = 4;
      do {
        SMaterialLayer::operator=((SMaterialLayer *)&other[5].TextureMatrix,other);
        other = other + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      *(undefined2 *)&(this->LastMaterial).field_0xb0 = *(undefined2 *)&(this->Material).field_0xb0;
      uVar8 = (this->Material).AntiAliasing;
      uVar9 = *(undefined2 *)&(this->Material).field_0xa2;
      fVar10 = (this->Material).BlendFactor;
      fVar11 = (this->Material).PolygonOffsetDepthBias;
      fVar12 = (this->Material).PolygonOffsetSlopeScale;
      (this->LastMaterial).ZBuffer = (this->Material).ZBuffer;
      (this->LastMaterial).AntiAliasing = uVar8;
      *(undefined2 *)&(this->LastMaterial).field_0xa2 = uVar9;
      (this->LastMaterial).BlendFactor = fVar10;
      (this->LastMaterial).PolygonOffsetDepthBias = fVar11;
      (this->LastMaterial).PolygonOffsetSlopeScale = fVar12;
      fVar10 = (this->Material).Shininess;
      fVar11 = (this->Material).MaterialTypeParam;
      fVar12 = (this->Material).Thickness;
      (this->LastMaterial).SpecularColor = (SColor)(this->Material).SpecularColor.color;
      (this->LastMaterial).Shininess = fVar10;
      (this->LastMaterial).MaterialTypeParam = fVar11;
      (this->LastMaterial).Thickness = fVar12;
      uVar5 = (this->Material).AmbientColor.color;
      uVar6 = (this->Material).DiffuseColor.color;
      uVar7 = (this->Material).EmissiveColor.color;
      (this->LastMaterial).MaterialType = (this->Material).MaterialType;
      (this->LastMaterial).AmbientColor.color = uVar5;
      (this->LastMaterial).DiffuseColor.color = uVar6;
      (this->LastMaterial).EmissiveColor.color = uVar7;
      pCVar2 = this->CacheHandler;
      lVar14 = 0;
      do {
        if ((*(long *)((long)&(this->LastMaterial).TextureLayers[0].Texture + lVar14 * 4) != 0) &&
           (*(long *)((long)(pCVar2->TextureCache).Texture + lVar14) == 0)) {
          *(undefined8 *)((long)&(this->LastMaterial).TextureLayers[0].Texture + lVar14 * 4) = 0;
        }
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x20);
      this->ResetRenderStates = false;
    }
    EVar1 = (this->Material).MaterialType;
    pSVar3 = (this->super_CNullDriver).MaterialRenderers.m_data.
             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3
                                    ) >> 3) * -0x33333333)) {
      pIVar4 = pSVar3[EVar1].Renderer;
      (*pIVar4->_vptr_IMaterialRenderer[1])(pIVar4,&(this->super_CNullDriver).field_0x490,0);
    }
    this->CurrentRenderMode = ERM_3D;
    return;
  }
  return;
}

Assistant:

void COpenGL3DriverBase::setRenderStates3DMode()
{
	if (LockRenderStateMode)
		return;

	if (CurrentRenderMode != ERM_3D) {
		// Reset Texture Stages
		CacheHandler->setBlend(false);
		CacheHandler->setBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

		ResetRenderStates = true;
	}

	if (ResetRenderStates || LastMaterial != Material) {
		// unset old material

		// unset last 3d material
		if (CurrentRenderMode == ERM_2D && MaterialRenderer2DActive) {
			MaterialRenderer2DActive->OnUnsetMaterial();
			MaterialRenderer2DActive = 0;
		} else if (LastMaterial.MaterialType != Material.MaterialType &&
				   static_cast<u32>(LastMaterial.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[LastMaterial.MaterialType].Renderer->OnUnsetMaterial();

		// set new material.
		if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[Material.MaterialType].Renderer->OnSetMaterial(
					Material, LastMaterial, ResetRenderStates, this);

		LastMaterial = Material;
		CacheHandler->correctCacheMaterial(LastMaterial);
		ResetRenderStates = false;
	}

	if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
		MaterialRenderers[Material.MaterialType].Renderer->OnRender(this, video::EVT_STANDARD);

	CurrentRenderMode = ERM_3D;
}